

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>
::_find_key<phmap::priv::(anonymous_namespace)::DecomposeType>
          (raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_TransparentEqIntOverload,_std::allocator<int>_>
           *this,DecomposeType *key,size_t hashval)

{
  char *pcVar1;
  uint uVar2;
  ushort uVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  byte bVar8;
  ulong uVar9;
  bool bVar10;
  __m128i match;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  probe_seq<16UL> seq;
  probe_seq<16UL> local_38;
  char cVar13;
  char cVar15;
  char cVar16;
  char cVar17;
  
  if (this->ctrl_ != (ctrl_t *)0x0) {
    probe(&local_38,this,hashval);
    bVar8 = (byte)hashval;
    uVar4 = (ulong)(bVar8 & 0x7f);
    auVar11 = ZEXT216(CONCAT11(bVar8,bVar8) & 0x7f7f);
    auVar11 = pshuflw(auVar11,auVar11,0);
    do {
      pcVar1 = this->ctrl_ + local_38.offset_;
      cVar13 = auVar11[0];
      auVar14[0] = -(cVar13 == *pcVar1);
      cVar15 = auVar11[1];
      auVar14[1] = -(cVar15 == pcVar1[1]);
      cVar16 = auVar11[2];
      auVar14[2] = -(cVar16 == pcVar1[2]);
      cVar17 = auVar11[3];
      auVar14[3] = -(cVar17 == pcVar1[3]);
      auVar14[4] = -(cVar13 == pcVar1[4]);
      auVar14[5] = -(cVar15 == pcVar1[5]);
      auVar14[6] = -(cVar16 == pcVar1[6]);
      auVar14[7] = -(cVar17 == pcVar1[7]);
      auVar14[8] = -(cVar13 == pcVar1[8]);
      auVar14[9] = -(cVar15 == pcVar1[9]);
      auVar14[10] = -(cVar16 == pcVar1[10]);
      auVar14[0xb] = -(cVar17 == pcVar1[0xb]);
      auVar14[0xc] = -(cVar13 == pcVar1[0xc]);
      auVar14[0xd] = -(cVar15 == pcVar1[0xd]);
      auVar14[0xe] = -(cVar16 == pcVar1[0xe]);
      auVar14[0xf] = -(cVar17 == pcVar1[0xf]);
      uVar3 = (ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe | (ushort)(auVar14[0xf] >> 7) << 0xf;
      iVar7 = 4;
      bVar10 = uVar3 == 0;
      if (!bVar10) {
        uVar5 = (uint)uVar3;
        do {
          uVar2 = 0;
          if (uVar5 != 0) {
            for (; (uVar5 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
            }
          }
          uVar9 = uVar2 + local_38.offset_ & local_38.mask_;
          if (this->slots_[uVar9].i == key->i) {
            iVar7 = 1;
            uVar4 = uVar9;
            break;
          }
          uVar5 = uVar5 - 1 & uVar5;
          bVar10 = uVar5 == 0;
        } while (!bVar10);
      }
      if (bVar10) {
        auVar12[0] = -(*pcVar1 == -0x80);
        auVar12[1] = -(pcVar1[1] == -0x80);
        auVar12[2] = -(pcVar1[2] == -0x80);
        auVar12[3] = -(pcVar1[3] == -0x80);
        auVar12[4] = -(pcVar1[4] == -0x80);
        auVar12[5] = -(pcVar1[5] == -0x80);
        auVar12[6] = -(pcVar1[6] == -0x80);
        auVar12[7] = -(pcVar1[7] == -0x80);
        auVar12[8] = -(pcVar1[8] == -0x80);
        auVar12[9] = -(pcVar1[9] == -0x80);
        auVar12[10] = -(pcVar1[10] == -0x80);
        auVar12[0xb] = -(pcVar1[0xb] == -0x80);
        auVar12[0xc] = -(pcVar1[0xc] == -0x80);
        auVar12[0xd] = -(pcVar1[0xd] == -0x80);
        auVar12[0xe] = -(pcVar1[0xe] == -0x80);
        auVar12[0xf] = -(pcVar1[0xf] == -0x80);
        iVar7 = 3;
        if ((((((((((((((((auVar12 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar12 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar12 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar12 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar12 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar12 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar12 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar12 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar12 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar12 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar12 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar12 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar12 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar12 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar12 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar12[0xf]
           ) {
          lVar6 = local_38.offset_ + local_38.index_;
          local_38.index_ = local_38.index_ + 0x10;
          local_38.offset_ = lVar6 + 0x10U & local_38.mask_;
          iVar7 = 0;
        }
      }
    } while (iVar7 == 0);
    if (iVar7 != 3) {
      return uVar4;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t _find_key(const K& PHMAP_RESTRICT key, size_t hashval) {
        PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
            // ctrl_ could be nullptr
            if (!ctrl_)
                return (size_t)-1;
        }
        auto seq = probe(hashval);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            for (uint32_t i : g.Match((h2_t)H2(hashval))) {
                if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
                                          EqualElement<K>{key, eq_ref()},
                                          PolicyTraits::element(slots_ + seq.offset((size_t)i)))))
                    return seq.offset((size_t)i);
            }
            if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) break;
            seq.next();
        }
        return (size_t)-1;
    }